

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Problem_CGBG_FF::FilterObservationsForHouse
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Problem_CGBG_FF *this,Index hI,Scope *tupleOfAgents,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *types)

{
  Index typeI;
  pointer puVar1;
  pointer pvVar2;
  long lVar3;
  iterator __position;
  bool bVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> obsIndices;
  uint local_6c;
  Problem_CGBG_FF *local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  Scope *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  ulong local_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar5 = (tupleOfAgents->super_SDT).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((tupleOfAgents->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar5) {
    uVar8 = 0;
    local_68 = this;
    local_48 = tupleOfAgents;
    local_40 = types;
    do {
      puVar1 = (local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
      }
      uVar7 = (ulong)puVar5[uVar8];
      pvVar2 = (local_68->_m_houseIndices_obs).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(local_68->_m_houseIndices_obs).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
              -0x5555555555555555;
      if (uVar6 < uVar7 || uVar6 - uVar7 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      typeI = puVar1[uVar8];
      local_38 = uVar8;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_60,
                 (long)*(pointer *)
                        ((long)&pvVar2[uVar7].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&pvVar2[uVar7].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data >> 2,(allocator_type *)&local_6c);
      TypeIndexToObservationIndices(local_68,typeI,&local_60);
      if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar8 = 0;
        uVar6 = 1;
        do {
          lVar3 = *(long *)&pvVar2[uVar7].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data;
          if ((ulong)((long)*(pointer *)
                             ((long)&pvVar2[uVar7].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data + 8) - lVar3 >> 2) <= uVar8) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          if (*(Index *)(lVar3 + uVar8 * 4) == hI) {
            local_6c = local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar8];
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(__return_storage_ptr__,__position,&local_6c);
            }
            else {
              *__position._M_current = local_6c;
              (__return_storage_ptr__->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
          bVar4 = uVar6 < (ulong)((long)local_60.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_60.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2);
          uVar8 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar4);
      }
      if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar8 = (ulong)((int)local_38 + 1);
      puVar5 = (local_48->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(local_48->super_SDT).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Problem_CGBG_FF::observation_t> Problem_CGBG_FF::FilterObservationsForHouse(
        Index hI,  
        const Scope& tupleOfAgents,
        const vector<Index>& types
    ) const
{
    vector<Problem_CGBG_FF::observation_t> allObservationsForHouse_hI;

    for(Index i=0; i < tupleOfAgents.size(); i++)
    {
        Index agI = tupleOfAgents[i];
        Index typeI = types.at(i);
        //vector<Index> obsIndices = TypeIndexToObservationIndices(agI, typeAgI);
        const vector<Index> & obsHouseIndices = _m_houseIndices_obs.at(agI);
        vector<Index> obsIndices(obsHouseIndices.size());
        TypeIndexToObservationIndices(typeI, obsIndices);
#if DEBUGPROBS
        cout << "\tAgent " << agI << ", observations: " << SoftPrintVector(obsIndices) <<
            " for houses:" << SoftPrintVector(obsHouseIndices) << " (typeI="<<typeI<<")"<<endl;
#endif
 
        for(Index o=0; o < obsIndices.size(); o++)
            if(obsHouseIndices.at(o) == hI)
                allObservationsForHouse_hI.push_back(
                    (Problem_CGBG_FF::observation_t) obsIndices.at(o)
                    );
    }
    return allObservationsForHouse_hI;
}